

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::logMessage(Federate *this,int level,string_view message)

{
  element_type *peVar1;
  ostream *poVar2;
  
  peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_Core[0x53])(peVar1,(ulong)(uint)(this->fedID).fid);
    return;
  }
  if (level < 4) {
    poVar2 = (ostream *)&std::cerr;
  }
  else {
    poVar2 = (ostream *)&std::cout;
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,message._M_str,message._M_len);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void Federate::logMessage(int level, std::string_view message) const
{
    if (coreObject) {
        coreObject->logMessage(fedID, level, message);
    } else if (level <= HELICS_LOG_LEVEL_WARNING) {
        std::cerr << message << '\n';
    } else {
        std::cout << message << '\n';
    }
}